

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_initialize_test.cpp
# Opt level: O2

void __thiscall
metacall_initialize_test_DefaultConstructor_Test::~metacall_initialize_test_DefaultConstructor_Test
          (metacall_initialize_test_DefaultConstructor_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(metacall_initialize_test, DefaultConstructor)
{
	metacall_print_info();

	ASSERT_EQ((int)0, (int)metacall_initialize());

	ASSERT_EQ((int)1, (int)metacall_is_initialized("mock"));

/* Mock */
#if defined(OPTION_BUILD_LOADERS_MOCK)
	{
		const char *mock_scripts[] = {
			"empty.mock"
		};

		EXPECT_EQ((int)0, (int)metacall_load_from_file("mock", mock_scripts, sizeof(mock_scripts) / sizeof(mock_scripts[0]), NULL));

		ASSERT_EQ((int)0, (int)metacall_is_initialized("mock"));
	}
#endif /* OPTION_BUILD_LOADERS_MOCK */

	metacall_destroy();
}